

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void init_smooth_interintra_masks(void)

{
  int bh;
  int bw;
  int bs;
  int m;
  int local_8;
  int local_4;
  
  for (local_4 = 0; local_4 < 4; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 0x16; local_8 = local_8 + 1) {
      if ((block_size_wide[local_8] < 0x21) && (block_size_high[local_8] < 0x21)) {
        build_smooth_interintra_mask(_bs,bw,bh._3_1_,bh._2_1_);
      }
    }
  }
  return;
}

Assistant:

static inline void init_smooth_interintra_masks(void) {
  for (int m = 0; m < INTERINTRA_MODES; ++m) {
    for (int bs = 0; bs < BLOCK_SIZES_ALL; ++bs) {
      const int bw = block_size_wide[bs];
      const int bh = block_size_high[bs];
      if (bw > MAX_WEDGE_SIZE || bh > MAX_WEDGE_SIZE) continue;
      build_smooth_interintra_mask(smooth_interintra_mask_buf[m][bs], bw, bs,
                                   m);
    }
  }
}